

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_CALLBACK::OAssign(_Type_CALLBACK *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  Object *pOVar2;
  Type *pTVar3;
  Callback *c;
  Callback *this_00;
  Variable *in_RCX;
  uint *extraout_RDX;
  Variable VVar4;
  Variable local_38;
  Variable *local_28;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_CALLBACK *this_local;
  
  local_28 = in_RCX;
  obj2_local = obj2;
  obj1_local = obj1;
  this_local = this;
  pOVar2 = Variable::operator->(in_RCX);
  pTVar3 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(pTVar3,(Type *)obj1);
  if (bVar1) {
    pOVar2 = Variable::operator->(local_28);
    pTVar3 = Object::GetType(pOVar2);
    pOVar2 = Variable::operator*(obj2_local);
    (*pTVar3->_vptr_Type[1])(pTVar3,pOVar2);
    pOVar2 = Variable::operator->(obj2_local);
    pTVar3 = Object::GetType(pOVar2);
    (*pTVar3->_vptr_Type[3])(&local_38,pTVar3,obj2_local,local_28);
    Variable::~Variable(&local_38);
  }
  else {
    pOVar2 = Variable::operator->(local_28);
    c = Object::GetData<LiteScript::Callback>(pOVar2);
    pOVar2 = Variable::operator->(obj2_local);
    this_00 = Object::GetData<LiteScript::Callback>(pOVar2);
    Callback::operator=(this_00,c);
  }
  Variable::Variable((Variable *)this,obj2_local);
  VVar4.nb_ref = extraout_RDX;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CALLBACK::OAssign(Variable &obj1, const Variable &obj2) const {
    if (obj2->GetType() != *this) {
        obj2->GetType().AssignObject(*obj1);
        obj1->GetType().OAssign(obj1, obj2);
    }
    else {
        obj1->GetData<Callback>() = obj2->GetData<Callback>();
    }
    return Variable(obj1);
}